

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HToyIO.cpp
# Opt level: O1

int readToy_MIP_cpp(char *filename,int *m_p,int *n_p,int *maxmin,double *offset,double **A,
                   double **b,double **c,double **lb,double **ub,int **integerColumn)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  FILE *__stream;
  double *pdVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  ulong __n;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  double dVar16;
  byte local_138 [264];
  
  iVar15 = 0;
  printf("readMPS: Trying to open file %s\n",filename);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    puts("readInput: Not opened file OK");
  }
  else {
    puts("readInput: Opened file  OK");
    fgets((char *)local_138,0xff,__stream);
    __isoc99_sscanf(local_138,"%d %d %d",m_p,n_p,maxmin);
    iVar1 = *n_p;
    lVar14 = (long)iVar1;
    iVar9 = *m_p;
    sVar8 = lVar14 * 8;
    pdVar5 = (double *)malloc(sVar8);
    *c = pdVar5;
    pdVar5 = (double *)malloc((long)(iVar9 * iVar1) << 3);
    *A = pdVar5;
    pdVar5 = (double *)malloc((long)iVar9 << 3);
    *b = pdVar5;
    pdVar5 = (double *)malloc(sVar8);
    *lb = pdVar5;
    pdVar5 = (double *)malloc(sVar8);
    *ub = pdVar5;
    piVar6 = (int *)malloc(lVar14 * 4);
    *integerColumn = piVar6;
    fgets((char *)local_138,0xff,__stream);
    lVar11 = 0;
    do {
      if (iVar1 < iVar15) {
        iVar15 = 0;
        do {
          if (iVar9 <= iVar15) {
            if (0 < iVar1) {
              pdVar5 = *lb;
              pdVar2 = *ub;
              piVar6 = *integerColumn;
              lVar11 = 0;
              do {
                pdVar5[lVar11] = 0.0;
                pdVar2[lVar11] = 1e+200;
                piVar6[lVar11] = 0;
                lVar11 = lVar11 + 1;
              } while (lVar14 != lVar11);
            }
            pcVar7 = fgets((char *)local_138,0xff,__stream);
            if (pcVar7 != (char *)0x0) {
              iVar9 = 1;
              iVar15 = 0;
              lVar11 = 0;
              while (iVar15 < iVar1) {
                lVar11 = (long)(int)lVar11 + -1;
                do {
                  lVar14 = lVar11;
                  lVar11 = lVar14 + 1;
                } while (local_138[lVar14 + 1] == 0x20);
                sVar8 = 0;
                for (lVar13 = lVar11; (local_138[lVar13] & 0xdf) != 0; lVar13 = lVar13 + 1) {
                  sVar8 = sVar8 + 1;
                }
                uVar4 = (int)lVar13 - (int)lVar11;
                if (uVar4 == 0 || (int)lVar13 < (int)lVar11) {
                  puts("Comment reading file: no numbers on LB row.");
                  bVar3 = false;
                  iVar9 = 0;
                }
                else {
                  pcVar7 = (char *)malloc((ulong)uVar4);
                  memcpy(pcVar7,local_138 + lVar14 + 1,sVar8);
                  dVar16 = atof(pcVar7);
                  (*lb)[iVar15] = dVar16;
                  iVar15 = iVar15 + 1;
                  if ((iVar15 < iVar1) && (local_138[lVar13] == 0)) {
                    puts("Error reading file: not enough numbers on LB row.");
                    iVar9 = 1;
                    bVar3 = false;
                  }
                  else {
                    lVar11 = lVar13 + 1;
                    bVar3 = true;
                  }
                }
                if (!bVar3) {
                  return iVar9;
                }
              }
              pcVar7 = fgets((char *)local_138,0xff,__stream);
              if (pcVar7 != (char *)0x0) {
                iVar15 = 0;
                lVar11 = 0;
                while (iVar15 < iVar1) {
                  lVar11 = (long)(int)lVar11 + -1;
                  do {
                    lVar14 = lVar11;
                    lVar11 = lVar14 + 1;
                  } while (local_138[lVar14 + 1] == 0x20);
                  sVar8 = 0;
                  for (lVar13 = lVar11; (local_138[lVar13] & 0xdf) != 0; lVar13 = lVar13 + 1) {
                    sVar8 = sVar8 + 1;
                  }
                  uVar4 = (int)lVar13 - (int)lVar11;
                  if (uVar4 == 0 || (int)lVar13 < (int)lVar11) {
                    puts("Comment reading file: no numbers on UB row.");
                    bVar3 = false;
                    iVar9 = 0;
                  }
                  else {
                    pcVar7 = (char *)malloc((ulong)uVar4);
                    memcpy(pcVar7,local_138 + lVar14 + 1,sVar8);
                    dVar16 = atof(pcVar7);
                    (*ub)[iVar15] = dVar16;
                    iVar15 = iVar15 + 1;
                    if ((iVar15 < iVar1) && (local_138[lVar13] == 0)) {
                      puts("Error reading file: not enough numbers on UB row.");
                      iVar9 = 1;
                      bVar3 = false;
                    }
                    else {
                      lVar11 = lVar13 + 1;
                      bVar3 = true;
                    }
                  }
                  if (!bVar3) {
                    return iVar9;
                  }
                }
                pcVar7 = fgets((char *)local_138,0xff,__stream);
                if (pcVar7 != (char *)0x0) {
                  iVar15 = 0;
                  lVar11 = 0;
                  while (iVar15 < iVar1) {
                    lVar11 = (long)(int)lVar11 + -1;
                    do {
                      lVar14 = lVar11;
                      lVar11 = lVar14 + 1;
                    } while (local_138[lVar14 + 1] == 0x20);
                    sVar8 = 0;
                    for (lVar13 = lVar11; (local_138[lVar13] & 0xdf) != 0; lVar13 = lVar13 + 1) {
                      sVar8 = sVar8 + 1;
                    }
                    uVar4 = (int)lVar13 - (int)lVar11;
                    if (uVar4 == 0 || (int)lVar13 < (int)lVar11) {
                      puts("Comment reading file: no numbers on integerColumn row.");
                      bVar3 = false;
                      iVar9 = 0;
                    }
                    else {
                      pcVar7 = (char *)malloc((ulong)uVar4);
                      memcpy(pcVar7,local_138 + lVar14 + 1,sVar8);
                      iVar12 = atoi(pcVar7);
                      (*integerColumn)[iVar15] = iVar12;
                      iVar15 = iVar15 + 1;
                      if ((iVar15 < iVar1) && (local_138[lVar13] == 0)) {
                        puts("Error reading file: not enough numbers on integerColumn row.");
                        iVar9 = 1;
                        bVar3 = false;
                      }
                      else {
                        lVar11 = lVar13 + 1;
                        bVar3 = true;
                      }
                    }
                    if (!bVar3) {
                      return iVar9;
                    }
                  }
                }
              }
            }
            fclose(__stream);
            return 0;
          }
          fgets((char *)local_138,0xff,__stream);
          for (lVar11 = 0; local_138[lVar11] == 0x20; lVar11 = lVar11 + 1) {
          }
          if (local_138[lVar11] == 0) {
            printf("Error reading file: not enough numbers on row %d of A.\n");
          }
          iVar12 = 0;
          while (iVar12 < iVar1) {
            lVar11 = (long)(int)lVar11 + -1;
            do {
              lVar13 = lVar11;
              lVar11 = lVar13 + 1;
            } while (local_138[lVar13 + 1] == 0x20);
            sVar8 = 0;
            for (lVar10 = lVar11; (local_138[lVar10] & 0xdf) != 0; lVar10 = lVar10 + 1) {
              sVar8 = sVar8 + 1;
            }
            uVar4 = (int)lVar10 - (int)lVar11;
            if (uVar4 == 0 || (int)lVar10 < (int)lVar11) {
              pcVar7 = "Error reading file: not enough numbers on row for RHS.";
LAB_00155d5c:
              puts(pcVar7);
              bVar3 = false;
            }
            else {
              pcVar7 = (char *)malloc((ulong)uVar4);
              memcpy(pcVar7,local_138 + lVar13 + 1,sVar8);
              dVar16 = atof(pcVar7);
              (*A)[iVar12 * iVar9 + iVar15] = dVar16;
              iVar12 = iVar12 + 1;
              if (local_138[lVar10] == 0) {
                pcVar7 = "Error reading file: not enough numbers on constraint row.";
                goto LAB_00155d5c;
              }
              lVar11 = lVar10 + 1;
              bVar3 = true;
            }
            if (!bVar3) {
              return 1;
            }
          }
          lVar11 = (long)(int)lVar11 + -1;
          do {
            lVar13 = lVar11;
            lVar11 = lVar13 + 1;
          } while (local_138[lVar13 + 1] == 0x20);
          for (__n = 0; ((local_138 + lVar13 + 1)[__n] & 0xdf) != 0; __n = __n + 1) {
          }
          if ((int)__n < 1) {
            puts("Error reading file: not enough numbers on constraint row.");
            return 1;
          }
          pcVar7 = (char *)malloc(__n & 0xffffffff);
          memcpy(pcVar7,local_138 + lVar13 + 1,__n);
          dVar16 = atof(pcVar7);
          (*b)[iVar15] = dVar16;
          iVar15 = iVar15 + 1;
        } while( true );
      }
      lVar11 = (long)(int)lVar11 + -1;
      do {
        lVar13 = lVar11;
        lVar11 = lVar13 + 1;
      } while (local_138[lVar13 + 1] == 0x20);
      sVar8 = 0;
      for (lVar10 = lVar11; (local_138[lVar10] & 0xdf) != 0; lVar10 = lVar10 + 1) {
        sVar8 = sVar8 + 1;
      }
      uVar4 = (int)lVar10 - (int)lVar11;
      if (uVar4 == 0 || (int)lVar10 < (int)lVar11) {
LAB_00155c1f:
        puts("Error reading file: not enough numbers on row of objective.");
        bVar3 = false;
      }
      else {
        pcVar7 = (char *)malloc((ulong)uVar4);
        memcpy(pcVar7,local_138 + lVar13 + 1,sVar8);
        dVar16 = atof(pcVar7);
        if (iVar15 < iVar1) {
          (*c)[iVar15] = dVar16;
          iVar15 = iVar15 + 1;
          if (local_138[lVar10] == 0) goto LAB_00155c1f;
          lVar11 = lVar10 + 1;
          bVar3 = true;
        }
        else {
          *offset = dVar16;
          iVar15 = iVar15 + 1;
          bVar3 = true;
        }
      }
    } while (bVar3);
  }
  return 1;
}

Assistant:

int readToy_MIP_cpp(const char *filename, int* m_p, int* n_p, int* maxmin, double* offset,
		  double ** A,
		  double ** b, double ** c, double ** lb, double ** ub,
		  int** integerColumn) {
  const int buff_ln=255;
  char buff[buff_ln];
  char *fgets_rt;
  int n, m;
  int start, end;
  int rp_rd = 0;
  double rl_v;
  int i_v;
  char *term;
  int i, j, k;
  
#ifdef JAJH_dev
    printf("readMPS: Trying to open file %s\n", filename);
#endif
    FILE *file_p = fopen(filename, "r");
    if (file_p == 0) {
#ifdef JAJH_dev
      printf("readInput: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("readInput: Opened file  OK\n");
#endif
    fgets_rt = fgets(buff, buff_ln, file_p);
    
    sscanf(buff, "%d %d %d", m_p, n_p, maxmin);
    if (rp_rd > 0) printf("Read %d %d %d for m_p, n_p, maxmin\n", *(m_p), *(n_p), *(maxmin));
    n = *(n_p);
    m = *(m_p);
    
    //Allocate arrays
    *c = (double *) malloc(sizeof(double)*n);
    *A = (double *) malloc(sizeof(double)*(m*n));
    *b = (double *) malloc(sizeof(double)*m);
    *lb = (double *) malloc(sizeof(double)*n);
    *ub = (double *) malloc(sizeof(double)*n);
    *integerColumn = (int *) malloc(sizeof(int)*n);

    fgets_rt = fgets(buff, buff_ln, file_p);
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    //Read cost and offset
    j = 0;
    start = 0;
    while ( j <= n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on row of objective.\n");
	return 1;
      }
      
      rl_v = atof(term);
      if (j < n) {
	(*c)[j] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*c)[%d]\n", term, rl_v, j);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on row of objective.\n");
	  return 1;
	}	
	start = end + 1;
      }
      else {
	*offset = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for offset\n", term, rl_v);
	j++;
      }
    }
    
    //Read matrix and RHS
    i = 0;
    while (i < m) {
      fgets_rt = fgets(buff, buff_ln, file_p);
      
      start=0;
      while (buff[start]==' ' &&  buff[start] != '\0')
	start++;
      
      //JAJH: QY - This doesn't seem to do what was intended
      if (buff[start] == '\0')
	printf("Error reading file: not enough numbers on row %d of A.\n", i);
      
      j = 0;
      while (j < n) {
	while (buff[start]==' ')
	  start++;
	
	end = start;
	while (buff[end]!=' ' && buff[end] != '\0')
	  end++;
	
	int len = end - start;
	
	if (len>0) {
	  term = (char *) malloc(sizeof(char)*len);
	  for (k=0;k<len;k++)
	    term[k] = buff[start+k];
	} else {
	  //JAJH: QY - LEN<=0 means that the end of the line has been reached
	  printf("Error reading file: not enough numbers on row for RHS.\n");
	  return 1;
	}
	
	rl_v = atof(term);
	
	//Row-wise
	//	int ind = (i * n) + j;
	//Column-wise
	int ind = (j * m) + i;
	(*A)[ind] = rl_v;
	if (rp_rd > 0) printf("Read %s giving %g for (*A)[%d]\n", term, rl_v, ind);
	j++;
	if (buff[end] == '\0') {
	  printf("Error reading file: not enough numbers on constraint row.\n");
	  return 1;
	}	
	start = end + 1;
      }
      
      //RHS
      while (buff[start]==' ')
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Error reading file: not enough numbers on constraint row.\n");
	return 1;
      }
      
      rl_v = atof(term);
      (*b)[i] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*b)[%d]\n", term, rl_v, i);
      i++;
    }
    //Set up default values of lower bounds, upper bounds and integer information
    for (int c_n = 0; c_n < n; c_n++) {
      (*lb)[c_n] = 0;
      (*ub)[c_n] = HSOL_CONST_INF;
      (*integerColumn)[c_n] = 0;
    }

    //Read lower bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("LB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;

      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on LB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*lb)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*lb)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on LB row.\n");
	return 1;
      }
      start = end + 1;
    }
    
    //Read upper bounds on columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("UB: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on UB row.\n");
	return 0;
      }
      
      rl_v = atof(term);
      (*ub)[j] = rl_v;
      if (rp_rd > 0) printf("Read %s giving %g for (*ub)[%d]\n", term, rl_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on UB row.\n");
	return 1;
      }
      start = end + 1;
    }

    //Read integer information for columns
    fgets_rt = fgets(buff, buff_ln, file_p);
    if (rp_rd > 0) printf("IC: fgets return value = %s\n", fgets_rt);
    if (fgets_rt == NULL) {
      fclose(file_p);
      return 0;
    }
    start=0;
    while (buff[start]==' ' &&  buff[start] != '\0') {
      //      printf("buff[%3d] = %s\n", start, buff[start]);
      start++;}
    
    j = 0;
    start = 0;
    while ( j < n ) {
      if (rp_rd > 0) printf("\n Col %d\n", j);
      while (buff[start]==' ') 
	start++;
      
      end = start;
      while (buff[end]!=' ' && buff[end] != '\0')
	end++;
      
      int len = end - start;
      if (rp_rd > 0) printf("buff: start =%2d, len =%2d, end =%2d\n", start, len, end);
      if (len>0) {
	term = (char *) malloc(sizeof(char)*len);
	for (k=0;k<len;k++)
	  term[k] = buff[start+k];
      } else {
	//JAJH: QY - LEN<=0 means that the end of the line has been reached
	printf("Comment reading file: no numbers on integerColumn row.\n");
	return 0;
      }
      
      i_v = atoi(term);
      (*integerColumn)[j] = i_v;
      if (rp_rd > 0) printf("Read %s giving %d for (*integerColumn)[%d]\n", term, i_v, j);
      j++;
      if (j<n && buff[end] == '\0') {
	printf("Error reading file: not enough numbers on integerColumn row.\n");
	return 1;
      }
      start = end + 1;
    }
    fclose(file_p);
    return 0;
}